

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  byte *data;
  LodePNGColorMode *info;
  LodePNGColorMode *info_00;
  LodePNGInfo *info_01;
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  bool bVar7;
  uchar **ppuVar8;
  uint *puVar9;
  uchar uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  size_t i;
  uchar *puVar17;
  uchar *puVar18;
  size_t sVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  size_t bytewidth;
  bool bVar28;
  ulong local_2c8;
  uchar *scanlines;
  uchar **local_268;
  uint *local_260;
  size_t *local_258;
  uchar **local_250;
  size_t scanlines_size;
  size_t local_240;
  uint passh_1 [7];
  uint passw_1 [7];
  uint passh [7];
  uint passw [7];
  size_t passstart [8];
  size_t local_178 [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  scanlines = (uchar *)0x0;
  scanlines_size = 0;
  *out = (uchar *)0x0;
  *h = 0;
  *w = 0;
  uVar11 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar11;
  if (uVar11 == 0) {
    uVar15 = *w;
    uVar14 = *h;
    uVar11 = 0x5c;
    if (CONCAT44(0,uVar14) * (ulong)uVar15 >> 0x3d == 0) {
      info = &(state->info_png).color;
      info_00 = &state->info_raw;
      local_268 = out;
      local_260 = h;
      uVar12 = lodepng_get_bpp(info);
      uVar13 = lodepng_get_bpp(info_00);
      if (uVar13 < uVar12) {
        uVar13 = uVar12;
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (ulong)(uVar15 >> 3) * (ulong)uVar13 +
                     ((ulong)(uVar15 & 7) * (ulong)uVar13 + 7 >> 3) + 5;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = CONCAT44(0,uVar14);
      if (SUB168(auVar4 * auVar5,8) == 0) {
        puVar17 = (uchar *)malloc(insize);
        if (puVar17 != (uchar *)0x0) {
          info_01 = &state->info_png;
          puVar18 = in + 0x21;
          local_250 = (state->info_png).unknown_chunks_data;
          local_258 = (state->info_png).unknown_chunks_size;
          iVar16 = 1;
          local_2c8 = 0;
          bVar28 = false;
LAB_0010d318:
          data = puVar18 + 8;
LAB_0010d33b:
          puVar9 = local_260;
          if (!bVar28) {
            if (insize < puVar18 + (0xc - (long)in) || puVar18 < in) {
              if ((state->decoder).ignore_end != 0) goto LAB_0010d770;
              uVar11 = 0x1e;
              goto LAB_0010dae5;
            }
            uVar11 = lodepng_read32bitInt(puVar18);
            if ((int)uVar11 < 0) {
              if ((state->decoder).ignore_end != 0) goto LAB_0010d770;
              uVar11 = 0x3f;
              goto LAB_0010dae5;
            }
            uVar23 = (ulong)uVar11;
            if (insize < puVar18 + (0xc - (long)in) + uVar23) {
              uVar11 = 0x40;
              goto LAB_0010dae5;
            }
            uVar10 = lodepng_chunk_type_equals(puVar18,"IDAT");
            if (uVar10 != '\0') {
              if ((!CARRY8(local_2c8,uVar23)) && (local_2c8 + uVar23 <= insize)) {
                lodepng_memcpy(puVar17 + local_2c8,data,uVar23);
                iVar16 = 3;
                local_2c8 = local_2c8 + uVar23;
                goto LAB_0010d3d7;
              }
              uVar11 = 0x5f;
              goto LAB_0010dae5;
            }
            uVar10 = lodepng_chunk_type_equals(puVar18,"IEND");
            if (uVar10 != '\0') {
              bVar28 = true;
              bVar7 = false;
LAB_0010d3f8:
              if (((state->decoder).ignore_crc == 0) &&
                 (uVar11 = lodepng_chunk_check_crc(puVar18), uVar11 != 0)) {
                uVar11 = 0x39;
                goto LAB_0010dae5;
              }
              if (bVar7) goto LAB_0010d717;
              goto LAB_0010d33b;
            }
            uVar10 = lodepng_chunk_type_equals(puVar18,"PLTE");
            if (uVar10 != '\0') {
              uVar11 = readChunk_PLTE(info,data,uVar23);
              state->error = uVar11;
              if (uVar11 == 0) {
                iVar16 = 2;
                goto LAB_0010d3d7;
              }
              goto LAB_0010daed;
            }
            uVar10 = lodepng_chunk_type_equals(puVar18,"tRNS");
            if (uVar10 == '\0') {
              uVar10 = lodepng_chunk_type_equals(puVar18,"bKGD");
              if (uVar10 != '\0') {
                uVar11 = readChunk_bKGD(info_01,data,uVar23);
                goto LAB_0010d4ba;
              }
              uVar10 = lodepng_chunk_type_equals(puVar18,"tEXt");
              if (uVar10 != '\0') {
                if ((state->decoder).read_text_chunks == 0) goto LAB_0010d3d7;
                uVar11 = readChunk_tEXt(info_01,data,uVar23);
LAB_0010d573:
                state->error = uVar11;
                goto joined_r0x0010d57d;
              }
              uVar10 = lodepng_chunk_type_equals(puVar18,"zTXt");
              if (uVar10 != '\0') {
                if ((state->decoder).read_text_chunks != 0) {
                  uVar11 = readChunk_zTXt(info_01,&state->decoder,data,uVar23);
                  goto LAB_0010d573;
                }
                goto LAB_0010d3d7;
              }
              uVar10 = lodepng_chunk_type_equals(puVar18,"iTXt");
              if (uVar10 != '\0') {
                if ((state->decoder).read_text_chunks != 0) {
                  uVar11 = readChunk_iTXt(info_01,&state->decoder,data,uVar23);
                  goto LAB_0010d573;
                }
                goto LAB_0010d3d7;
              }
              uVar10 = lodepng_chunk_type_equals(puVar18,"tIME");
              if (uVar10 == '\0') {
                uVar10 = lodepng_chunk_type_equals(puVar18,"pHYs");
                if (uVar10 == '\0') {
                  uVar10 = lodepng_chunk_type_equals(puVar18,"gAMA");
                  if (uVar10 == '\0') {
                    uVar10 = lodepng_chunk_type_equals(puVar18,"cHRM");
                    if (uVar10 != '\0') {
                      uVar11 = readChunk_cHRM(info_01,data,uVar23);
                      goto LAB_0010d4ba;
                    }
                    uVar10 = lodepng_chunk_type_equals(puVar18,"sRGB");
                    if (uVar10 == '\0') {
                      uVar10 = lodepng_chunk_type_equals(puVar18,"iCCP");
                      if (uVar10 != '\0') {
                        uVar11 = readChunk_iCCP(info_01,&state->decoder,data,uVar23);
                        goto LAB_0010d4ba;
                      }
                      if (((state->decoder).ignore_critical == 0) && ((puVar18[4] & 0x20) == 0)) {
                        uVar11 = 0x45;
                        goto LAB_0010dae5;
                      }
                      if ((state->decoder).remember_unknown_chunks != 0) {
                        uVar11 = lodepng_chunk_append
                                           (local_250 + (iVar16 - 1U),local_258 + (iVar16 - 1U),
                                            puVar18);
                        state->error = uVar11;
                        if (uVar11 != 0) goto LAB_0010daed;
                      }
                      bVar28 = false;
                      goto LAB_0010d717;
                    }
                    if (uVar11 == 1) {
                      (state->info_png).srgb_defined = 1;
                      (state->info_png).srgb_intent = (uint)*data;
                      state->error = 0;
                      goto LAB_0010d3d7;
                    }
                    uVar11 = 0x62;
                    goto LAB_0010dae5;
                  }
                  uVar11 = readChunk_gAMA(info_01,data,uVar23);
                }
                else {
                  uVar11 = readChunk_pHYs(info_01,data,uVar23);
                }
              }
              else {
                uVar11 = readChunk_tIME(info_01,data,uVar23);
              }
            }
            else {
              uVar11 = readChunk_tRNS(info,data,uVar23);
            }
LAB_0010d4ba:
            state->error = uVar11;
joined_r0x0010d57d:
            if (uVar11 != 0) goto LAB_0010daed;
LAB_0010d3d7:
            bVar28 = false;
            bVar7 = true;
            goto LAB_0010d3f8;
          }
LAB_0010d770:
          if ((info->colortype == LCT_PALETTE) && ((state->info_png).color.palette == (uchar *)0x0))
          {
            uVar11 = 0x6a;
LAB_0010dae5:
            state->error = uVar11;
LAB_0010daed:
            free(puVar17);
            goto LAB_0010dda2;
          }
          uVar11 = (state->info_png).interlace_method;
          uVar14 = lodepng_get_bpp(info);
          uVar15 = *w;
          uVar23 = (ulong)uVar14;
          if (uVar11 == 0) {
            sVar21 = (uVar23 * (uVar15 >> 3) + (ulong)((uVar15 & 7) * uVar14 + 7 >> 3) + 1) *
                     (ulong)*puVar9;
          }
          else {
            uVar13 = *puVar9;
            lVar24 = (uVar15 + 7 >> 6) * uVar23 + (ulong)((uVar15 + 7 >> 3 & 7) * uVar14 + 7 >> 3) +
                     1;
            uVar11 = uVar15 + 3;
            if (4 < uVar15) {
              lVar24 = lVar24 + (ulong)((uVar11 >> 3 & 7) * uVar14 + 7 >> 3) +
                                (uVar11 >> 6) * uVar23 + 1;
            }
            lVar24 = (ulong)(uVar13 + 3 >> 3) *
                     ((uVar11 >> 5) * uVar23 + (ulong)((uVar11 >> 2 & 7) * uVar14 + 7 >> 3) + 1) +
                     lVar24 * (ulong)(uVar13 + 7 >> 3);
            uVar11 = uVar15 + 1;
            if (2 < uVar15) {
              lVar24 = lVar24 + (ulong)(uVar13 + 3 >> 2) *
                                ((ulong)((uVar11 >> 2 & 7) * uVar14 + 7 >> 3) +
                                 (uVar11 >> 5) * uVar23 + 1);
            }
            lVar24 = (ulong)(uVar13 + 1 >> 2) *
                     ((uVar11 >> 4) * uVar23 + (ulong)((uVar11 >> 1 & 7) * uVar14 + 7 >> 3) + 1) +
                     lVar24;
            if (1 < uVar15) {
              lVar24 = lVar24 + (ulong)(uVar13 + 1 >> 1) *
                                ((ulong)((uVar15 >> 1 & 7) * uVar14 + 7 >> 3) +
                                 (uVar15 >> 4) * uVar23 + 1);
            }
            sVar21 = ((uVar15 >> 3) * uVar23 + (ulong)((uVar15 & 7) * uVar14 + 7 >> 3) + 1) *
                     (ulong)(uVar13 >> 1) + lVar24;
          }
          uVar15 = zlib_decompress(&scanlines,&scanlines_size,sVar21,puVar17,local_2c8,
                                   (LodePNGDecompressSettings *)state);
          bVar28 = scanlines_size != sVar21;
          uVar11 = 0x5b;
          if (!bVar28) {
            uVar11 = uVar15;
          }
          if (uVar15 != 0) {
            uVar11 = uVar15;
          }
          state->error = uVar11;
          free(puVar17);
          if (bVar28 || uVar15 != 0) goto LAB_0010dda2;
          uVar11 = *w;
          uVar15 = *puVar9;
          sVar21 = lodepng_get_raw_size(uVar11,uVar15,info);
          puVar18 = (uchar *)malloc(sVar21);
          puVar17 = scanlines;
          *local_268 = puVar18;
          if (puVar18 == (uchar *)0x0) {
            uVar14 = 0x53;
            goto LAB_0010dd9a;
          }
          for (sVar19 = 0; sVar21 != sVar19; sVar19 = sVar19 + 1) {
            puVar18[sVar19] = '\0';
          }
          uVar13 = lodepng_get_bpp(info);
          if (uVar13 == 0) {
            uVar14 = 0x1f;
          }
          else if ((state->info_png).interlace_method == 0) {
            if (uVar13 < 8) {
              uVar12 = uVar13 * uVar11;
              uVar27 = uVar12 + 7 & 0xfffffff8;
              if (uVar12 != uVar27) {
                uVar14 = unfilter(puVar17,puVar17,uVar11,uVar15,uVar13);
                if (uVar14 == 0) {
                  removePaddingBits(puVar18,puVar17,(ulong)uVar12,(ulong)uVar27,uVar15);
                  goto LAB_0010dd98;
                }
                goto LAB_0010dd9a;
              }
            }
            uVar14 = unfilter(puVar18,puVar17,uVar11,uVar15,uVar13);
            if (uVar14 == 0) goto LAB_0010dd98;
          }
          else {
            Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,local_178,uVar11,
                                uVar15,uVar13);
            for (lVar24 = 0; lVar24 != 0x1c; lVar24 = lVar24 + 4) {
              lVar3 = *(long *)((long)padded_passstart + lVar24 * 2);
              uVar12 = *(uint *)((long)passw + lVar24);
              uVar27 = *(uint *)((long)passh + lVar24);
              uVar14 = unfilter(puVar17 + lVar3,
                                puVar17 + *(long *)((long)filter_passstart + lVar24 * 2),uVar12,
                                uVar27,uVar13);
              if (uVar14 != 0) goto LAB_0010dd9a;
              if (uVar13 < 8) {
                uVar12 = uVar12 * uVar13;
                removePaddingBits(puVar17 + *(long *)((long)local_178 + lVar24 * 2),puVar17 + lVar3,
                                  (ulong)uVar12,(ulong)(uVar12 + 7 & 0xfffffff8),uVar27);
              }
            }
            Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,passstart,
                                uVar11,uVar15,uVar13);
            if (uVar13 < 8) {
              for (lVar24 = 0; lVar24 != 7; lVar24 = lVar24 + 1) {
                uVar15 = passw_1[lVar24];
                uVar14 = passh_1[lVar24];
                for (uVar23 = 0; uVar23 != uVar14; uVar23 = uVar23 + 1) {
                  for (uVar26 = 0; uVar26 != uVar15; uVar26 = uVar26 + 1) {
                    uVar22 = (ulong)(((int)uVar23 * uVar15 + (int)uVar26) * uVar13) +
                             passstart[lVar24] * 8;
                    local_240 = (ADAM7_DX[lVar24] * uVar26 + (ulong)ADAM7_IX[lVar24]) *
                                (ulong)uVar13 +
                                (ADAM7_DY[lVar24] * uVar23 + (ulong)ADAM7_IY[lVar24]) *
                                (ulong)(uVar11 * uVar13);
                    uVar25 = (ulong)uVar13;
                    while (iVar16 = (int)uVar25, uVar25 = (ulong)(iVar16 - 1), iVar16 != 0) {
                      uVar20 = uVar22 >> 3;
                      bVar6 = (byte)uVar22;
                      uVar22 = uVar22 + 1;
                      setBitOfReversedStream
                                (&local_240,puVar18,(puVar17[uVar20] >> (~bVar6 & 7) & 1) != 0);
                    }
                  }
                }
              }
            }
            else {
              uVar23 = (ulong)(uVar13 >> 3);
              for (lVar24 = 0; lVar24 != 7; lVar24 = lVar24 + 1) {
                uVar15 = passh_1[lVar24];
                for (uVar26 = 0; uVar26 != uVar15; uVar26 = uVar26 + 1) {
                  uVar14 = passw_1[lVar24];
                  uVar13 = uVar14 * (int)uVar26;
                  for (uVar22 = 0; uVar22 != uVar14; uVar22 = uVar22 + 1) {
                    uVar12 = ADAM7_IY[lVar24];
                    uVar27 = ADAM7_IX[lVar24];
                    uVar1 = ADAM7_DX[lVar24];
                    uVar2 = ADAM7_DY[lVar24];
                    sVar21 = passstart[lVar24];
                    for (uVar25 = 0; uVar23 != uVar25; uVar25 = uVar25 + 1) {
                      puVar18[uVar25 + ((uVar2 * uVar26 + (ulong)uVar12) * (ulong)uVar11 +
                                       uVar1 * uVar22 + (ulong)uVar27) * uVar23] =
                           puVar17[uVar25 + uVar13 * uVar23 + sVar21];
                    }
                    uVar13 = uVar13 + 1;
                  }
                }
              }
            }
LAB_0010dd98:
            uVar14 = 0;
          }
LAB_0010dd9a:
          state->error = uVar14;
LAB_0010dda2:
          free(scanlines);
          if (state->error != 0) {
            return state->error;
          }
          if ((state->decoder).color_convert == 0) {
            uVar11 = lodepng_color_mode_copy(info_00,info);
            state->error = uVar11;
            return uVar11;
          }
          iVar16 = lodepng_color_mode_equal(info_00,info);
          ppuVar8 = local_268;
          if (iVar16 != 0) {
            return 0;
          }
          puVar17 = *local_268;
          if (((info_00->colortype | LCT_GREY_ALPHA) != LCT_RGBA) &&
             ((state->info_raw).bitdepth != 8)) {
            return 0x38;
          }
          uVar11 = *w;
          uVar15 = *local_260;
          sVar21 = lodepng_get_raw_size(uVar11,uVar15,info_00);
          puVar18 = (uchar *)malloc(sVar21);
          *ppuVar8 = puVar18;
          if (puVar18 == (uchar *)0x0) {
            uVar11 = 0x53;
          }
          else {
            uVar11 = lodepng_convert(puVar18,puVar17,info_00,info,uVar11,uVar15);
          }
          state->error = uVar11;
          free(puVar17);
          return state->error;
        }
        uVar11 = 0x53;
      }
    }
    state->error = uVar11;
  }
  return uVar11;
LAB_0010d717:
  puVar18 = lodepng_chunk_next_const(puVar18,in + insize);
  goto LAB_0010d318;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize) {
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color)) {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert) {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  } else { /*color conversion needed*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from grayscale input color type, to 8-bit grayscale or grayscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8)) {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out)) {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}